

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector_tests.cpp
# Opt level: O0

void __thiscall prevector_tests::PrevectorTestInt::test_method(PrevectorTestInt *this)

{
  bool bVar1;
  Size SVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  uint32_t *puVar5;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *dst;
  long in_RDI;
  long in_FS_OFFSET;
  int *v;
  vector<int,_std::allocator<int>_> *__range4;
  uint num_1;
  int beg_1;
  int del_1;
  int k;
  int num;
  int beg;
  int del;
  int new_size;
  int i;
  int j;
  iterator __end4;
  iterator __begin4;
  vector<int,_std::allocator<int>_> values_1;
  int values [4];
  prevector_tester<8U,_int> test;
  prevector_tester<8U,_int> *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  Size in_stack_fffffffffffffd84;
  prevector_tester<8U,_int> *in_stack_fffffffffffffd88;
  int *in_stack_fffffffffffffd90;
  prevector_tester<8U,_int> *in_stack_fffffffffffffd98;
  Size in_stack_fffffffffffffda0;
  uint in_stack_fffffffffffffda4;
  prevector_tester<8U,_int> *in_stack_fffffffffffffda8;
  Size in_stack_fffffffffffffdb0;
  Size in_stack_fffffffffffffdb4;
  prevector_tester<8U,_int> *in_stack_fffffffffffffdb8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  Size in_stack_fffffffffffffdd4;
  int local_170;
  int local_150;
  int local_14c;
  int local_111 [6];
  uint32_t local_f8;
  uint32_t local_f4;
  int local_f0;
  Size local_ec;
  uint32_t local_e8;
  int local_e4;
  Size local_e0;
  uint32_t local_dc;
  int local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  uint32_t local_cc;
  uint32_t local_c8 [6];
  prevector_tester<8U,_int> local_b0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_14c = 0; local_14c < 0x40; local_14c = local_14c + 1) {
    prevector_tester<8U,_int>::prevector_tester
              (in_stack_fffffffffffffdb8,
               (FastRandomContext *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
    for (local_150 = 0; local_150 < 0x800; local_150 = local_150 + 1) {
      uVar4 = RandomMixin<FastRandomContext>::randbits
                        ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd98,
                         (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
      if (uVar4 == 0) {
        prevector_tester<8U,_int>::size(in_stack_fffffffffffffd78);
        RandomMixin<FastRandomContext>::randrange<unsigned_int>
                  ((RandomMixin<FastRandomContext> *)
                   CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (uint)((ulong)in_stack_fffffffffffffd98 >> 0x20));
        local_cc = RandomMixin<FastRandomContext>::rand32
                             ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd78);
        prevector_tester<8U,_int>::insert
                  (in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,
                   (int *)in_stack_fffffffffffffd98);
      }
      SVar2 = prevector_tester<8U,_int>::size(in_stack_fffffffffffffd78);
      if (SVar2 != 0) {
        uVar4 = RandomMixin<FastRandomContext>::randbits
                          ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd98,
                           (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
        if (uVar4 == 1) {
          prevector_tester<8U,_int>::size(in_stack_fffffffffffffd78);
          RandomMixin<FastRandomContext>::randrange<unsigned_int>
                    ((RandomMixin<FastRandomContext> *)
                     CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     (uint)((ulong)in_stack_fffffffffffffd98 >> 0x20));
          prevector_tester<8U,_int>::erase(in_stack_fffffffffffffda8,in_stack_fffffffffffffda4);
        }
      }
      uVar4 = RandomMixin<FastRandomContext>::randbits
                        ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd98,
                         (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
      if (uVar4 == 2) {
        local_d0 = 0;
        local_d4 = 0x1e;
        SVar2 = prevector_tester<8U,_int>::size(in_stack_fffffffffffffd78);
        local_d8 = RandomMixin<FastRandomContext>::randrange<int>
                             ((RandomMixin<FastRandomContext> *)
                              CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                              (int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
        local_d8 = (SVar2 - 2) + local_d8;
        std::min<int>((int *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                      (int *)in_stack_fffffffffffffd78);
        std::max<int>((int *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                      (int *)in_stack_fffffffffffffd78);
        prevector_tester<8U,_int>::resize(in_stack_fffffffffffffd88,in_stack_fffffffffffffd84);
      }
      uVar4 = RandomMixin<FastRandomContext>::randbits
                        ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd98,
                         (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
      if (uVar4 == 3) {
        prevector_tester<8U,_int>::size(in_stack_fffffffffffffd78);
        RandomMixin<FastRandomContext>::randrange<unsigned_int>
                  ((RandomMixin<FastRandomContext> *)
                   CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (uint)((ulong)in_stack_fffffffffffffd98 >> 0x20));
        RandomMixin<FastRandomContext>::randbool
                  ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd78);
        local_dc = RandomMixin<FastRandomContext>::rand32
                             ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd78);
        prevector_tester<8U,_int>::insert
                  (in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,in_stack_fffffffffffffda0,
                   (int *)in_stack_fffffffffffffd98);
      }
      uVar4 = RandomMixin<FastRandomContext>::randbits
                        ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd98,
                         (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
      if (uVar4 == 4) {
        local_e0 = prevector_tester<8U,_int>::size(in_stack_fffffffffffffd78);
        bVar1 = RandomMixin<FastRandomContext>::randbool
                          ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd78);
        local_e4 = bVar1 + 1;
        std::min<int>((int *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                      (int *)in_stack_fffffffffffffd78);
        prevector_tester<8U,_int>::size(in_stack_fffffffffffffd78);
        RandomMixin<FastRandomContext>::randrange<unsigned_int>
                  ((RandomMixin<FastRandomContext> *)
                   CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (uint)((ulong)in_stack_fffffffffffffd98 >> 0x20));
        prevector_tester<8U,_int>::erase
                  (in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,in_stack_fffffffffffffda0);
      }
      uVar4 = RandomMixin<FastRandomContext>::randbits
                        ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd98,
                         (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
      if (uVar4 == 5) {
        local_e8 = RandomMixin<FastRandomContext>::rand32
                             ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd78);
        prevector_tester<8U,_int>::push_back
                  (in_stack_fffffffffffffd88,
                   (int *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
      }
      SVar2 = prevector_tester<8U,_int>::size(in_stack_fffffffffffffd78);
      if (SVar2 != 0) {
        uVar4 = RandomMixin<FastRandomContext>::randbits
                          ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd98,
                           (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
        if (uVar4 == 6) {
          prevector_tester<8U,_int>::pop_back(in_stack_fffffffffffffd78);
        }
      }
      uVar4 = RandomMixin<FastRandomContext>::randbits
                        ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd98,
                         (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
      if (uVar4 == 7) {
        uVar4 = RandomMixin<FastRandomContext>::randbits
                          ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd98,
                           (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
        for (local_170 = 0; local_170 < (int)uVar4 + 1; local_170 = local_170 + 1) {
          uVar3 = RandomMixin<FastRandomContext>::rand32
                            ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd78);
          local_c8[local_170] = uVar3;
        }
        prevector_tester<8U,_int>::size(in_stack_fffffffffffffd78);
        RandomMixin<FastRandomContext>::randrange<unsigned_int>
                  ((RandomMixin<FastRandomContext> *)
                   CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (uint)((ulong)in_stack_fffffffffffffd98 >> 0x20));
        prevector_tester<8u,int>::insert_range<int*>
                  (in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,
                   (int *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
      }
      uVar4 = RandomMixin<FastRandomContext>::randbits
                        ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd98,
                         (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
      if (uVar4 == 8) {
        in_stack_fffffffffffffdd4 = prevector_tester<8U,_int>::size(in_stack_fffffffffffffd78);
        local_ec = in_stack_fffffffffffffdd4;
        uVar4 = RandomMixin<FastRandomContext>::randbits
                          ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd98,
                           (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
        local_f0 = (int)uVar4 + 1;
        in_stack_fffffffffffffdc8 =
             (vector<int,_std::allocator<int>_> *)
             std::min<int>((int *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                           (int *)in_stack_fffffffffffffd78);
        in_stack_fffffffffffffdb8 = (prevector_tester<8U,_int> *)(in_RDI + 0x110);
        prevector_tester<8U,_int>::size(in_stack_fffffffffffffd78);
        RandomMixin<FastRandomContext>::randrange<unsigned_int>
                  ((RandomMixin<FastRandomContext> *)
                   CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (uint)((ulong)in_stack_fffffffffffffd98 >> 0x20));
        prevector_tester<8U,_int>::erase
                  (in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,in_stack_fffffffffffffda0);
      }
      uVar4 = RandomMixin<FastRandomContext>::randbits
                        ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd98,
                         (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
      if (uVar4 == 9) {
        RandomMixin<FastRandomContext>::randbits
                  ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd98,
                   (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
        prevector_tester<8U,_int>::reserve(in_stack_fffffffffffffd88,in_stack_fffffffffffffd84);
      }
      uVar4 = RandomMixin<FastRandomContext>::randbits
                        ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd98,
                         (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
      if (uVar4 == 10) {
        prevector_tester<8U,_int>::shrink_to_fit(in_stack_fffffffffffffd78);
      }
      in_stack_fffffffffffffdb4 = prevector_tester<8U,_int>::size(in_stack_fffffffffffffd78);
      if (in_stack_fffffffffffffdb4 != 0) {
        in_stack_fffffffffffffda8 = (prevector_tester<8U,_int> *)(in_RDI + 0x110);
        in_stack_fffffffffffffdb0 = prevector_tester<8U,_int>::size(in_stack_fffffffffffffd78);
        in_stack_fffffffffffffda4 =
             RandomMixin<FastRandomContext>::randrange<unsigned_int>
                       ((RandomMixin<FastRandomContext> *)
                        CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                        (uint)((ulong)in_stack_fffffffffffffd98 >> 0x20));
        local_f4 = RandomMixin<FastRandomContext>::rand32
                             ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd78);
        prevector_tester<8U,_int>::update
                  (in_stack_fffffffffffffd98,(Size)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                   (int *)in_stack_fffffffffffffd88);
      }
      uVar4 = RandomMixin<FastRandomContext>::randbits
                        ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd98,
                         (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
      if (uVar4 == 0xb) {
        prevector_tester<8U,_int>::clear(in_stack_fffffffffffffd78);
      }
      uVar4 = RandomMixin<FastRandomContext>::randbits
                        ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd98,
                         (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
      if (uVar4 == 0xc) {
        in_stack_fffffffffffffd98 = (prevector_tester<8U,_int> *)(in_RDI + 0x110);
        uVar4 = RandomMixin<FastRandomContext>::randbits
                          ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd98,
                           (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
        in_stack_fffffffffffffda0 = (Size)uVar4;
        local_f8 = RandomMixin<FastRandomContext>::rand32
                             ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd78);
        prevector_tester<8U,_int>::assign
                  (in_stack_fffffffffffffd88,in_stack_fffffffffffffd84,
                   (int *)in_stack_fffffffffffffd78);
      }
      uVar4 = RandomMixin<FastRandomContext>::randbits
                        ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd98,
                         (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
      if (uVar4 == 3) {
        prevector_tester<8U,_int>::swap(in_stack_fffffffffffffd78);
      }
      dst = (EVP_PKEY_CTX *)&DAT_00000004;
      uVar4 = RandomMixin<FastRandomContext>::randbits
                        ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd98,
                         (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
      if (uVar4 == 8) {
        prevector_tester<8U,_int>::copy(&local_b0,dst,src);
      }
      uVar4 = RandomMixin<FastRandomContext>::randbits
                        ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd98,
                         (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
      if (uVar4 == 0x12) {
        prevector_tester<8U,_int>::move(in_stack_fffffffffffffd88);
      }
      uVar4 = RandomMixin<FastRandomContext>::randbits
                        ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd98,
                         (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
      if (uVar4 == 0x13) {
        uVar4 = RandomMixin<FastRandomContext>::randbits
                          ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd98,
                           (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
        in_stack_fffffffffffffd88 = (prevector_tester<8U,_int> *)(ulong)((int)uVar4 + 1);
        in_stack_fffffffffffffd90 = local_111;
        std::allocator<int>::allocator((allocator<int> *)in_stack_fffffffffffffd78);
        std::vector<int,_std::allocator<int>_>::vector
                  (&in_stack_fffffffffffffda8->real_vector,
                   CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (allocator_type *)in_stack_fffffffffffffd98);
        std::allocator<int>::~allocator((allocator<int> *)in_stack_fffffffffffffd78);
        std::vector<int,_std::allocator<int>_>::begin
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
        std::vector<int,_std::allocator<int>_>::end
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
        while( true ) {
          bVar1 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             in_stack_fffffffffffffd88,
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
          if (((bVar1 ^ 0xffU) & 1) == 0) break;
          puVar5 = (uint32_t *)
                   __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             in_stack_fffffffffffffd78);
          uVar3 = RandomMixin<FastRandomContext>::rand32
                            ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffd78);
          *puVar5 = uVar3;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_fffffffffffffd78);
        }
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                   in_stack_fffffffffffffdc8);
        prevector_tester<8U,_int>::resize_uninitialized
                  ((prevector_tester<8U,_int> *)
                   CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                   in_stack_fffffffffffffdc8);
        std::vector<int,_std::allocator<int>_>::~vector(&in_stack_fffffffffffffd88->real_vector);
        std::vector<int,_std::allocator<int>_>::~vector(&in_stack_fffffffffffffd88->real_vector);
      }
    }
    prevector_tester<8U,_int>::~prevector_tester
              ((prevector_tester<8U,_int> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(PrevectorTestInt)
{
    for (int j = 0; j < 64; j++) {
        prevector_tester<8, int> test{m_rng};
        for (int i = 0; i < 2048; i++) {
            if (m_rng.randbits(2) == 0) {
                test.insert(m_rng.randrange(test.size() + 1), int(m_rng.rand32()));
            }
            if (test.size() > 0 && m_rng.randbits(2) == 1) {
                test.erase(m_rng.randrange(test.size()));
            }
            if (m_rng.randbits(3) == 2) {
                int new_size = std::max(0, std::min(30, (int)test.size() + (int)m_rng.randrange(5) - 2));
                test.resize(new_size);
            }
            if (m_rng.randbits(3) == 3) {
                test.insert(m_rng.randrange(test.size() + 1), 1 + m_rng.randbool(), int(m_rng.rand32()));
            }
            if (m_rng.randbits(3) == 4) {
                int del = std::min<int>(test.size(), 1 + (m_rng.randbool()));
                int beg = m_rng.randrange(test.size() + 1 - del);
                test.erase(beg, beg + del);
            }
            if (m_rng.randbits(4) == 5) {
                test.push_back(int(m_rng.rand32()));
            }
            if (test.size() > 0 && m_rng.randbits(4) == 6) {
                test.pop_back();
            }
            if (m_rng.randbits(5) == 7) {
                int values[4];
                int num = 1 + (m_rng.randbits(2));
                for (int k = 0; k < num; k++) {
                    values[k] = int(m_rng.rand32());
                }
                test.insert_range(m_rng.randrange(test.size() + 1), values, values + num);
            }
            if (m_rng.randbits(5) == 8) {
                int del = std::min<int>(test.size(), 1 + (m_rng.randbits(2)));
                int beg = m_rng.randrange(test.size() + 1 - del);
                test.erase(beg, beg + del);
            }
            if (m_rng.randbits(5) == 9) {
                test.reserve(m_rng.randbits(5));
            }
            if (m_rng.randbits(6) == 10) {
                test.shrink_to_fit();
            }
            if (test.size() > 0) {
                test.update(m_rng.randrange(test.size()), int(m_rng.rand32()));
            }
            if (m_rng.randbits(10) == 11) {
                test.clear();
            }
            if (m_rng.randbits(9) == 12) {
                test.assign(m_rng.randbits(5), int(m_rng.rand32()));
            }
            if (m_rng.randbits(3) == 3) {
                test.swap();
            }
            if (m_rng.randbits(4) == 8) {
                test.copy();
            }
            if (m_rng.randbits(5) == 18) {
                test.move();
            }
            if (m_rng.randbits(5) == 19) {
                unsigned int num = 1 + (m_rng.randbits(4));
                std::vector<int> values(num);
                for (int& v : values) {
                    v = int(m_rng.rand32());
                }
                test.resize_uninitialized(values);
            }
        }
    }
}